

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_FullRHS(ARKodeMem ark_mem,sunrealtype t,N_Vector y,N_Vector f,int mode)

{
  sunrealtype *psVar1;
  int iVar2;
  int in_ECX;
  N_Vector in_RDX;
  N_Vector in_RSI;
  ARKodeMem in_RDI;
  bool bVar3;
  ARKodeMem in_XMM0_Qa;
  sunrealtype stage_coefs;
  N_Vector *Xvecs;
  sunrealtype *cvals;
  int recomputeRHS;
  int retval;
  int nvec;
  ARKodeARKStepMem step_mem;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  ARKodeMem in_stack_ffffffffffffffa8;
  N_Vector *pp_Var4;
  int local_3c;
  ARKodeARKStepMem local_38;
  int local_2c;
  N_Vector local_28;
  N_Vector local_20;
  ARKodeMem local_18;
  ARKodeMem local_10;
  int local_4;
  
  local_2c = in_ECX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_XMM0_Qa;
  local_10 = in_RDI;
  local_4 = arkStep_AccessStepMem
                      (in_stack_ffffffffffffffa8,(char *)0x3ff0000000000000,
                       (ARKodeARKStepMem *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (local_4 == 0) {
    psVar1 = local_38->cvals;
    pp_Var4 = local_38->Xvecs;
    if (((local_38->mass_type == 2) && (local_38->msetup != (ARKMassSetupFn)0x0)) &&
       (iVar2 = (*local_38->msetup)(local_10,(sunrealtype)local_18,local_28,local_10->tempv2,
                                    local_10->tempv3), iVar2 != 0)) {
      local_4 = -0xf;
    }
    else {
      if (local_2c == 0) {
        if (local_10->fn_is_current == 0) {
          if (local_38->explicit != 0) {
            iVar2 = (*local_38->fe)((sunrealtype)local_18,local_20,*local_38->Fe,local_10->user_data
                                   );
            local_38->nfe = local_38->nfe + 1;
            if (iVar2 != 0) {
              arkProcessError(local_18,(int)local_10,-8,(char *)0x534,"arkStep_FullRHS",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                              ,
                              "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                             );
              return -8;
            }
            if ((local_38->mass_type == 2) &&
               (iVar2 = (*local_38->msolve)(local_10,*local_38->Fe,local_38->nlscoef / local_10->h),
               iVar2 != 0)) {
              arkProcessError(local_10,-0x10,0x540,"arkStep_FullRHS",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                              ,"Mass matrix solver failure");
              return -0x10;
            }
          }
          if (local_38->implicit != 0) {
            iVar2 = (*local_38->fi)((sunrealtype)local_18,local_20,*local_38->Fi,local_10->user_data
                                   );
            local_38->nfi = local_38->nfi + 1;
            if (iVar2 != 0) {
              arkProcessError(local_18,(int)local_10,-8,(char *)0x54e,"arkStep_FullRHS",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                              ,
                              "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                             );
              return -8;
            }
            if ((local_38->mass_type == 2) &&
               (iVar2 = (*local_38->msolve)(local_10,*local_38->Fi,local_38->nlscoef / local_10->h),
               iVar2 != 0)) {
              arkProcessError(local_10,-0x10,0x55a,"arkStep_FullRHS",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                              ,"Mass matrix solver failure");
              return -0x10;
            }
          }
        }
        if ((local_38->explicit == 0) || (local_38->implicit == 0)) {
          if (local_38->implicit == 0) {
            N_VScale(0x3ff0000000000000,*local_38->Fe,local_28);
          }
          else {
            N_VScale(0x3ff0000000000000,*local_38->Fi,local_28);
          }
        }
        else {
          N_VLinearSum(0x3ff0000000000000,*local_38->Fi,*local_38->Fe,local_28);
        }
        if ((local_38->mass_type == 1) &&
           (iVar2 = (*local_38->msolve)(local_10,local_28,local_38->nlscoef / local_10->h),
           iVar2 != 0)) {
          arkProcessError(local_10,-0x10,0x57a,"arkStep_FullRHS",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                          ,"Mass matrix solver failure");
          return -0x10;
        }
        if ((local_38->expforcing != 0) || (local_38->impforcing != 0)) {
          *psVar1 = 1.0;
          *pp_Var4 = local_28;
          local_3c = 1;
          arkStep_ApplyForcing
                    (local_38,(sunrealtype *)&local_18,(sunrealtype *)&stack0xffffffffffffffa0,1,
                     &local_3c);
          N_VLinearCombination(local_3c,psVar1,pp_Var4,local_28);
        }
      }
      else if (local_2c == 1) {
        if (local_10->fn_is_current == 0) {
          bVar3 = false;
          if (local_38->explicit != 0) {
            iVar2 = ARKodeButcherTable_IsStifflyAccurate(local_38->Be);
            bVar3 = iVar2 == 0;
          }
          if ((local_38->implicit != 0) &&
             (iVar2 = ARKodeButcherTable_IsStifflyAccurate(local_38->Bi), iVar2 == 0)) {
            bVar3 = true;
          }
          if (local_10->relax_enabled != 0) {
            bVar3 = true;
          }
          if (bVar3) {
            if (local_38->explicit != 0) {
              iVar2 = (*local_38->fe)((sunrealtype)local_18,local_20,*local_38->Fe,
                                      local_10->user_data);
              local_38->nfe = local_38->nfe + 1;
              if (iVar2 != 0) {
                arkProcessError(local_18,(int)local_10,-8,(char *)0x5b1,"arkStep_FullRHS",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                                ,
                                "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                               );
                return -8;
              }
              if ((local_38->mass_type == 2) &&
                 (iVar2 = (*local_38->msolve)(local_10,*local_38->Fe,local_38->nlscoef / local_10->h
                                             ), iVar2 != 0)) {
                arkProcessError(local_10,-0x10,0x5bd,"arkStep_FullRHS",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                                ,"Mass matrix solver failure");
                return -0x10;
              }
            }
            if (local_38->implicit != 0) {
              iVar2 = (*local_38->fi)((sunrealtype)local_18,local_20,*local_38->Fi,
                                      local_10->user_data);
              local_38->nfi = local_38->nfi + 1;
              if (iVar2 != 0) {
                arkProcessError(local_18,(int)local_10,-8,(char *)0x5cb,"arkStep_FullRHS",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                                ,
                                "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                               );
                return -8;
              }
              if ((local_38->mass_type == 2) &&
                 (iVar2 = (*local_38->msolve)(local_10,*local_38->Fi,local_38->nlscoef / local_10->h
                                             ), iVar2 != 0)) {
                arkProcessError(local_10,-0x10,0x5d7,"arkStep_FullRHS",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                                ,"Mass matrix solver failure");
                return -0x10;
              }
            }
          }
          else {
            if (local_38->explicit != 0) {
              N_VScale(0x3ff0000000000000,local_38->Fe[local_38->stages + -1],*local_38->Fe);
            }
            if (local_38->implicit != 0) {
              N_VScale(0x3ff0000000000000,local_38->Fi[local_38->stages + -1],*local_38->Fi);
            }
          }
        }
        if ((local_38->explicit == 0) || (local_38->implicit == 0)) {
          if (local_38->implicit == 0) {
            N_VScale(0x3ff0000000000000,*local_38->Fe,local_28);
          }
          else {
            N_VScale(0x3ff0000000000000,*local_38->Fi,local_28);
          }
        }
        else {
          N_VLinearSum(0x3ff0000000000000,*local_38->Fi,*local_38->Fe,local_28);
        }
        if ((local_38->mass_type == 1) &&
           (iVar2 = (*local_38->msolve)(local_10,local_28,local_38->nlscoef / local_10->h),
           iVar2 != 0)) {
          arkProcessError(local_10,-0x10,0x603,"arkStep_FullRHS",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                          ,"Mass matrix solver failure");
          return -0x10;
        }
        if ((local_38->expforcing != 0) || (local_38->impforcing != 0)) {
          *psVar1 = 1.0;
          *pp_Var4 = local_28;
          local_3c = 1;
          arkStep_ApplyForcing
                    (local_38,(sunrealtype *)&local_18,(sunrealtype *)&stack0xffffffffffffffa0,1,
                     &local_3c);
          N_VLinearCombination(local_3c,psVar1,pp_Var4,local_28);
        }
      }
      else {
        if (local_2c != 2) {
          arkProcessError(local_10,-8,0x65a,"arkStep_FullRHS",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                          ,"Unknown full RHS mode");
          return -8;
        }
        if (local_38->explicit != 0) {
          iVar2 = (*local_38->fe)((sunrealtype)local_18,local_20,local_10->tempv2,
                                  local_10->user_data);
          local_38->nfe = local_38->nfe + 1;
          if (iVar2 != 0) {
            arkProcessError(local_18,(int)local_10,-8,(char *)0x61e,"arkStep_FullRHS",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                            ,
                            "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                           );
            return -8;
          }
        }
        if (local_38->implicit != 0) {
          iVar2 = (*local_38->fi)((sunrealtype)local_18,local_20,local_38->sdata,local_10->user_data
                                 );
          local_38->nfi = local_38->nfi + 1;
          if (iVar2 != 0) {
            arkProcessError(local_18,(int)local_10,-8,(char *)0x62b,"arkStep_FullRHS",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                            ,
                            "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                           );
            return -8;
          }
        }
        if ((local_38->explicit == 0) || (local_38->implicit == 0)) {
          if (local_38->implicit == 0) {
            N_VScale(0x3ff0000000000000,local_10->tempv2,local_28);
          }
          else {
            N_VScale(0x3ff0000000000000,local_38->sdata,local_28);
          }
        }
        else {
          N_VLinearSum(0x3ff0000000000000,local_38->sdata,local_10->tempv2,local_28);
        }
        if ((local_38->mass_type != 0) &&
           (iVar2 = (*local_38->msolve)(local_10,local_28,local_38->nlscoef / local_10->h),
           iVar2 != 0)) {
          arkProcessError(local_10,-0x10,0x646,"arkStep_FullRHS",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                          ,"Mass matrix solver failure");
          return -0x10;
        }
        if ((local_38->expforcing != 0) || (local_38->impforcing != 0)) {
          *psVar1 = 1.0;
          *pp_Var4 = local_28;
          local_3c = 1;
          arkStep_ApplyForcing
                    (local_38,(sunrealtype *)&local_18,(sunrealtype *)&stack0xffffffffffffffa0,1,
                     &local_3c);
          N_VLinearCombination(local_3c,psVar1,pp_Var4,local_28);
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int arkStep_FullRHS(ARKodeMem ark_mem, sunrealtype t, N_Vector y, N_Vector f,
                    int mode)
{
  ARKodeARKStepMem step_mem;
  int nvec, retval;
  sunbooleantype recomputeRHS;
  sunrealtype* cvals;
  N_Vector* Xvecs;
  sunrealtype stage_coefs = ONE;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* local shortcuts for use with fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* setup mass-matrix if required (use output f as a temporary) */
  if ((step_mem->mass_type == MASS_TIMEDEP) && (step_mem->msetup != NULL))
  {
    retval = step_mem->msetup((void*)ark_mem, t, f, ark_mem->tempv2,
                              ark_mem->tempv3);
    if (retval != ARK_SUCCESS) { return (ARK_MASSSETUP_FAIL); }
  }

  /* perform RHS functions contingent on 'mode' argument */
  switch (mode)
  {
  case ARK_FULLRHS_START:

    /* compute the full RHS */
    if (!(ark_mem->fn_is_current))
    {
      /* compute the explicit component */
      if (step_mem->explicit)
      {
        retval = step_mem->fe(t, y, step_mem->Fe[0], ark_mem->user_data);
        step_mem->nfe++;
        if (retval != 0)
        {
          arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__,
                          __FILE__, MSG_ARK_RHSFUNC_FAILED, t);
          return (ARK_RHSFUNC_FAIL);
        }

        /* compute and store M(t)^{-1} fe */
        if (step_mem->mass_type == MASS_TIMEDEP)
        {
          retval = step_mem->msolve((void*)ark_mem, step_mem->Fe[0],
                                    step_mem->nlscoef / ark_mem->h);
          if (retval)
          {
            arkProcessError(ark_mem, ARK_MASSSOLVE_FAIL, __LINE__, __func__,
                            __FILE__, "Mass matrix solver failure");
            return ARK_MASSSOLVE_FAIL;
          }
        }
      }

      /* compute the implicit component */
      if (step_mem->implicit)
      {
        retval = step_mem->fi(t, y, step_mem->Fi[0], ark_mem->user_data);
        step_mem->nfi++;
        if (retval != 0)
        {
          arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__,
                          __FILE__, MSG_ARK_RHSFUNC_FAILED, t);
          return (ARK_RHSFUNC_FAIL);
        }

        /* compute and store M(t)^{-1} fi */
        if (step_mem->mass_type == MASS_TIMEDEP)
        {
          retval = step_mem->msolve((void*)ark_mem, step_mem->Fi[0],
                                    step_mem->nlscoef / ark_mem->h);
          if (retval)
          {
            arkProcessError(ark_mem, ARK_MASSSOLVE_FAIL, __LINE__, __func__,
                            __FILE__, "Mass matrix solver failure");
            return ARK_MASSSOLVE_FAIL;
          }
        }
      }
    }

    /* combine RHS vector(s) into output */
    if (step_mem->explicit && step_mem->implicit)
    {
      /* ImEx */
      N_VLinearSum(ONE, step_mem->Fi[0], ONE, step_mem->Fe[0], f);
    }
    else if (step_mem->implicit)
    {
      /* implicit */
      N_VScale(ONE, step_mem->Fi[0], f);
    }
    else
    {
      /* explicit */
      N_VScale(ONE, step_mem->Fe[0], f);
    }

    /* compute M^{-1} f for output but do not store */
    if (step_mem->mass_type == MASS_FIXED)
    {
      retval = step_mem->msolve((void*)ark_mem, f,
                                step_mem->nlscoef / ark_mem->h);
      if (retval)
      {
        arkProcessError(ark_mem, ARK_MASSSOLVE_FAIL, __LINE__, __func__,
                        __FILE__, "Mass matrix solver failure");
        return ARK_MASSSOLVE_FAIL;
      }
    }

    /* apply external polynomial (MRI) forcing (M = I required) */
    if (step_mem->expforcing || step_mem->impforcing)
    {
      cvals[0] = ONE;
      Xvecs[0] = f;
      nvec     = 1;
      arkStep_ApplyForcing(step_mem, &t, &stage_coefs, 1, &nvec);
      N_VLinearCombination(nvec, cvals, Xvecs, f);
    }

    break;

  case ARK_FULLRHS_END:

    /* compute the full RHS */
    if (!(ark_mem->fn_is_current))
    {
      /* determine if RHS functions need to be recomputed */
      recomputeRHS = SUNFALSE;

      if (step_mem->explicit)
      {
        if (!ARKodeButcherTable_IsStifflyAccurate(step_mem->Be))
        {
          recomputeRHS = SUNTRUE;
        }
      }

      if (step_mem->implicit)
      {
        if (!ARKodeButcherTable_IsStifflyAccurate(step_mem->Bi))
        {
          recomputeRHS = SUNTRUE;
        }
      }

      /* Stiffly Accurate methods are not SA when relaxation is enabled */
      if (ark_mem->relax_enabled) { recomputeRHS = SUNTRUE; }

      /* recompute RHS functions */
      if (recomputeRHS)
      {
        /* compute the explicit component */
        if (step_mem->explicit)
        {
          retval = step_mem->fe(t, y, step_mem->Fe[0], ark_mem->user_data);
          step_mem->nfe++;
          if (retval != 0)
          {
            arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__,
                            __FILE__, MSG_ARK_RHSFUNC_FAILED, t);
            return (ARK_RHSFUNC_FAIL);
          }

          /* compute and store M(t)^{-1} fi */
          if (step_mem->mass_type == MASS_TIMEDEP)
          {
            retval = step_mem->msolve((void*)ark_mem, step_mem->Fe[0],
                                      step_mem->nlscoef / ark_mem->h);
            if (retval)
            {
              arkProcessError(ark_mem, ARK_MASSSOLVE_FAIL, __LINE__, __func__,
                              __FILE__, "Mass matrix solver failure");
              return ARK_MASSSOLVE_FAIL;
            }
          }
        }

        /* compute the implicit component */
        if (step_mem->implicit)
        {
          retval = step_mem->fi(t, y, step_mem->Fi[0], ark_mem->user_data);
          step_mem->nfi++;
          if (retval != 0)
          {
            arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__,
                            __FILE__, MSG_ARK_RHSFUNC_FAILED, t);
            return (ARK_RHSFUNC_FAIL);
          }

          /* compute and store M(t)^{-1} fi */
          if (step_mem->mass_type == MASS_TIMEDEP)
          {
            retval = step_mem->msolve((void*)ark_mem, step_mem->Fi[0],
                                      step_mem->nlscoef / ark_mem->h);
            if (retval)
            {
              arkProcessError(ark_mem, ARK_MASSSOLVE_FAIL, __LINE__, __func__,
                              __FILE__, "Mass matrix solver failure");
              return ARK_MASSSOLVE_FAIL;
            }
          }
        }
      }
      else
      {
        if (step_mem->explicit)
        {
          N_VScale(ONE, step_mem->Fe[step_mem->stages - 1], step_mem->Fe[0]);
        }
        if (step_mem->implicit)
        {
          N_VScale(ONE, step_mem->Fi[step_mem->stages - 1], step_mem->Fi[0]);
        }
      }
    }

    /* combine RHS vector(s) into output */
    if (step_mem->explicit && step_mem->implicit)
    {
      /* ImEx */
      N_VLinearSum(ONE, step_mem->Fi[0], ONE, step_mem->Fe[0], f);
    }
    else if (step_mem->implicit)
    {
      /* implicit */
      N_VScale(ONE, step_mem->Fi[0], f);
    }
    else
    {
      /* explicit */
      N_VScale(ONE, step_mem->Fe[0], f);
    }

    /* compute M^{-1} f for output but do not store */
    if (step_mem->mass_type == MASS_FIXED)
    {
      retval = step_mem->msolve((void*)ark_mem, f,
                                step_mem->nlscoef / ark_mem->h);
      if (retval)
      {
        arkProcessError(ark_mem, ARK_MASSSOLVE_FAIL, __LINE__, __func__,
                        __FILE__, "Mass matrix solver failure");
        return ARK_MASSSOLVE_FAIL;
      }
    }

    /* apply external polynomial (MRI) forcing (M = I required) */
    if (step_mem->expforcing || step_mem->impforcing)
    {
      cvals[0] = ONE;
      Xvecs[0] = f;
      nvec     = 1;
      arkStep_ApplyForcing(step_mem, &t, &stage_coefs, 1, &nvec);
      N_VLinearCombination(nvec, cvals, Xvecs, f);
    }

    break;

  case ARK_FULLRHS_OTHER:

    /* compute the explicit component and store in ark_tempv2 */
    if (step_mem->explicit)
    {
      retval = step_mem->fe(t, y, ark_mem->tempv2, ark_mem->user_data);
      step_mem->nfe++;
      if (retval != 0)
      {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                        MSG_ARK_RHSFUNC_FAILED, t);
        return (ARK_RHSFUNC_FAIL);
      }
    }

    /* compute the implicit component and store in sdata */
    if (step_mem->implicit)
    {
      retval = step_mem->fi(t, y, step_mem->sdata, ark_mem->user_data);
      step_mem->nfi++;
      if (retval != 0)
      {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                        MSG_ARK_RHSFUNC_FAILED, t);
        return (ARK_RHSFUNC_FAIL);
      }
    }

    /* combine RHS vector(s) into output */
    if (step_mem->explicit && step_mem->implicit)
    { /* ImEx */
      N_VLinearSum(ONE, step_mem->sdata, ONE, ark_mem->tempv2, f);
    }
    else if (step_mem->implicit)
    { /* implicit */
      N_VScale(ONE, step_mem->sdata, f);
    }
    else
    { /* explicit */
      N_VScale(ONE, ark_mem->tempv2, f);
    }

    /* compute M^{-1} f for output but do not store */
    if (step_mem->mass_type != MASS_IDENTITY)
    {
      retval = step_mem->msolve((void*)ark_mem, f,
                                step_mem->nlscoef / ark_mem->h);
      if (retval)
      {
        arkProcessError(ark_mem, ARK_MASSSOLVE_FAIL, __LINE__, __func__,
                        __FILE__, "Mass matrix solver failure");
        return ARK_MASSSOLVE_FAIL;
      }
    }

    /* apply external polynomial (MRI) forcing (M = I required) */
    if (step_mem->expforcing || step_mem->impforcing)
    {
      cvals[0] = ONE;
      Xvecs[0] = f;
      nvec     = 1;
      arkStep_ApplyForcing(step_mem, &t, &stage_coefs, 1, &nvec);
      N_VLinearCombination(nvec, cvals, Xvecs, f);
    }

    break;

  default:
    /* return with RHS failure if unknown mode is passed */
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    "Unknown full RHS mode");
    return (ARK_RHSFUNC_FAIL);
  }

  return (ARK_SUCCESS);
}